

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_or.h
# Opt level: O0

void __thiscall
draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::~StatusOr
          (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *this)

{
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *in_RDI;
  
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::~unique_ptr(in_RDI);
  Status::~Status((Status *)0x10d646);
  return;
}

Assistant:

StatusOr() {}